

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O0

void __thiscall bignum_t<32>::set(bignum_t<32> *this,vm_val_t *val)

{
  int iVar1;
  CVmObject *pCVar2;
  int *in_RSI;
  vm_val_t *in_RDI;
  char *unaff_retaddr;
  CVmObjBigNum *b;
  long in_stack_ffffffffffffffd8;
  vm_val_t *val_00;
  
  if (*in_RSI == 7) {
    CVmObjBigNum::set_int_val((char *)in_RDI,in_stack_ffffffffffffffd8);
    return;
  }
  val_00 = in_RDI;
  if (*in_RSI == 5) {
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[1])(pCVar2,CVmObjBigNum::metaclass_reg_);
    if (iVar1 != 0) {
      pCVar2 = vm_objp(0);
      goto LAB_002f6f84;
    }
  }
  pCVar2 = (CVmObject *)0x0;
LAB_002f6f84:
  if (pCVar2 == (CVmObject *)0x0) {
    iVar1 = vm_val_t::is_numeric(in_RDI);
    if (iVar1 == 0) {
      err_throw(0);
    }
    vm_val_t::num_to_double(in_RDI);
    CVmObjBigNum::set_double_val(unaff_retaddr,(double)val_00);
  }
  else {
    CVmObjBigNum::get_ext((CVmObjBigNum *)pCVar2);
    CVmObjBigNum::copy_val((char *)in_RSI,(char *)pCVar2,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void set(VMG_ const vm_val_t *val)
    {
        CVmObjBigNum *b;
        if (val->typ == VM_INT)
            CVmObjBigNum::set_int_val(ext, val->val.intval);
        else if ((b = vm_val_cast(CVmObjBigNum, val)) != 0)
            CVmObjBigNum::copy_val(ext, b->get_ext(), TRUE);
        else if (val->is_numeric(vmg0_))
            CVmObjBigNum::set_double_val(ext, val->num_to_double(vmg0_));
        else
            err_throw(VMERR_NUM_VAL_REQD);
    }